

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O2

int corpus_set_interval(uint32 n_skip,uint32 run_len)

{
  int iVar1;
  char *pcVar2;
  uint32 uVar3;
  bool bVar4;
  
  sv_run_len = run_len;
  sv_n_skip = n_skip;
  if (n_skip != 0) {
    uVar3 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x194,"skipping %d utts.\n",(ulong)n_skip);
    while( true ) {
      bVar4 = n_skip == 0;
      n_skip = n_skip - 1;
      begin = uVar3;
      if (bVar4) break;
      iVar1 = corpus_next_utt();
      if (iVar1 == 0) break;
      uVar3 = begin + 1;
    }
    pcVar2 = corpus_utt();
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x198,"Last utt skipped: %s\n",pcVar2);
  }
  if (run_len != 0xffffffff) {
    n_run = run_len;
  }
  n_proc = 0;
  return 0;
}

Assistant:

int
corpus_set_interval(uint32 n_skip,
		    uint32 run_len)
{
    sv_n_skip = n_skip;
    sv_run_len = run_len;

    if (n_skip) {
	E_INFO("skipping %d utts.\n", n_skip);
	
	for (begin = 0; (n_skip > 0) && corpus_next_utt(); --n_skip, begin++);
	
	E_INFO("Last utt skipped: %s\n", corpus_utt());
    }
    
    if (run_len != UNTIL_EOF)
	n_run = run_len;

    n_proc = 0;
    
    return S3_SUCCESS;
}